

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

boundaries __thiscall
fmt::v6::internal::fp::assign_float_with_boundaries<long_double>(fp *this,longdouble d)

{
  boundaries bVar1;
  undefined8 extraout_RDX;
  fp *in_RDI;
  fp fVar2;
  fp lower;
  fp upper;
  significand_type half_ulp;
  int min_normal_e;
  undefined8 in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff78;
  bool local_81;
  fp local_78;
  significand_type local_68;
  int local_60;
  fp local_58;
  significand_type local_48;
  int local_40;
  ulong local_38;
  undefined4 local_2c;
  
  assign<long_double,_0>
            (in_RDI,(longdouble)CONCAT28(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70));
  local_2c = 0xffffff4e;
  local_38 = 0x10000000;
  if (in_RDI->e < -0xb2) {
    local_38 = 0x10000000L << (0x4eU - (char)in_RDI->e & 0x3f);
  }
  fp(&local_58,in_RDI->f + local_38,in_RDI->e);
  fVar2.f = (ulong)(uint)local_58.e;
  fVar2._8_8_ = extraout_RDX;
  fVar2 = normalize<0>((internal *)local_58.f,fVar2);
  local_68 = fVar2.f;
  local_60 = fVar2.e;
  local_81 = false;
  if (in_RDI->f == 0x10000000000000) {
    local_81 = -0xb2 < in_RDI->e;
  }
  local_48 = local_68;
  local_40 = local_60;
  fp(&local_78,in_RDI->f - (local_38 >> local_81),in_RDI->e);
  bVar1.upper = local_48;
  bVar1.lower = local_78.f << ((char)local_78.e - (char)local_40 & 0x3fU);
  return bVar1;
}

Assistant:

boundaries assign_float_with_boundaries(Double d) {
    assign(d);
    constexpr int min_normal_e = std::numeric_limits<float>::min_exponent -
                                 std::numeric_limits<double>::digits;
    significand_type half_ulp = 1 << (std::numeric_limits<double>::digits -
                                      std::numeric_limits<float>::digits - 1);
    if (min_normal_e > e) half_ulp <<= min_normal_e - e;
    fp upper = normalize<0>(fp(f + half_ulp, e));
    fp lower = fp(
        f - (half_ulp >> ((f == implicit_bit && e > min_normal_e) ? 1 : 0)), e);
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }